

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomProcessingInstructionPrivate * __thiscall
QDomDocumentPrivate::createProcessingInstruction
          (QDomDocumentPrivate *this,QString *target,QString *data)

{
  QAtomicInt *pQVar1;
  longlong lVar2;
  QDomProcessingInstructionPrivate *this_00;
  long in_FS_OFFSET;
  QLatin1String QVar3;
  QLatin1String QVar4;
  bool ok;
  QString local_68;
  bool local_49;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_49 = true;
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (QDomImplementationPrivate::invalidDataPolicy == AcceptInvalidChars) {
    local_49 = true;
    local_68.d.d = (data->d).d;
    local_68.d.ptr = (data->d).ptr;
    local_68.d.size = (data->d).size;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    fixedCharData(&local_48,data,&local_49);
    if (local_49 == true) {
      QVar3.m_data = (char *)0x2;
      QVar3.m_size = (qsizetype)&local_48;
      lVar2 = QString::indexOf(QVar3,0x1209ab,CaseInsensitive);
      if (lVar2 != -1) {
        do {
          if (QDomImplementationPrivate::invalidDataPolicy == ReturnNullNode) {
            local_49 = false;
            goto LAB_00117568;
          }
          QString::remove((longlong)&local_48,lVar2);
          QVar4.m_data = (char *)0x2;
          QVar4.m_size = (qsizetype)&local_48;
          lVar2 = QString::indexOf(QVar4,0x1209ab,CaseInsensitive);
        } while (lVar2 != -1);
      }
      local_68.d.size = local_48.d.size;
      local_68.d.ptr = local_48.d.ptr;
      local_68.d.d = local_48.d.d;
      local_49 = true;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      local_48.d.size = 0;
    }
    else {
LAB_00117568:
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_68.d.size = 0;
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_49 == true) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QDomProcessingInstructionPrivate *)0x0;
    fixedXmlName(&local_48,target,&local_49,false);
    if (local_49 == true) {
      this_00 = (QDomProcessingInstructionPrivate *)operator_new(0xa8);
      QDomProcessingInstructionPrivate::QDomProcessingInstructionPrivate
                (this_00,this,(QDomNodePrivate *)0x0,&local_48,&local_68);
      LOCK();
      pQVar1 = &(this_00->super_QDomNodePrivate).ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    this_00 = (QDomProcessingInstructionPrivate *)0x0;
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDomProcessingInstructionPrivate* QDomDocumentPrivate::createProcessingInstruction(const QString &target,
                                                                                   const QString &data)
{
    bool ok;
    QString fixedData = fixedPIData(data, &ok);
    if (!ok)
        return nullptr;
    // [17] PITarget ::= Name - (('X' | 'x') ('M' | 'm') ('L' | 'l'))
    QString fixedTarget = fixedXmlName(target, &ok);
    if (!ok)
        return nullptr;

    QDomProcessingInstructionPrivate *p = new QDomProcessingInstructionPrivate(this, nullptr, fixedTarget, fixedData);
    p->ref.deref();
    return p;
}